

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,int index)

{
  bool bVar1;
  undefined4 in_ESI;
  handle sharedEpt;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffa8;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *this_00;
  int in_stack_ffffffffffffffe8;
  undefined1 *local_8;
  
  this_00 = (DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
             *)&stack0xffffffffffffffd0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
          *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator*((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
               *)this_00);
  bVar1 = isValidIndex<int,gmlc::containers::DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>>
                    ((int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffffa8);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator*((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                 *)&stack0xffffffffffffffd0);
    local_8 = (undefined1 *)
              gmlc::containers::
              DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
              ::operator[](this_00,(size_t)in_stack_ffffffffffffffa8);
  }
  else {
    local_8 = invalidEptNC;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x2ba1b7);
  return (Endpoint *)local_8;
}

Assistant:

Endpoint& MessageFederateManager::getEndpoint(int index)
{
    auto sharedEpt = mLocalEndpoints.lock();
    if (isValidIndex(index, *sharedEpt)) {
        return (*sharedEpt)[index];
    }
    return invalidEptNC;
}